

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coop.c
# Opt level: O0

void thread_switch(Thread *from,Thread *to)

{
  Sched *pSVar1;
  Fiber *from_00;
  Fiber *to_00;
  Sched *sched;
  Thread *to_local;
  Thread *from_local;
  
  pSVar1 = from->sched;
  if (pSVar1->running != from) {
    fprintf(_stderr,"requirement not met: %s\n","sched->running == from");
    abort();
  }
  if (the_thread != from) {
    fprintf(_stderr,"requirement not met: %s\n","the_thread == from");
    abort();
  }
  if (pSVar1->fuel != 0) {
    pSVar1->fuel = pSVar1->fuel - 1;
  }
  pSVar1->running = to;
  the_thread = to;
  from_00 = thread_fiber(from);
  to_00 = thread_fiber(to);
  fiber_switch(from_00,to_00);
  return;
}

Assistant:

static void
thread_switch(Thread *from, Thread *to)
{
    Sched *sched = from->sched;
    require(sched->running == from);
    require(the_thread == from);

    if (sched->fuel > 0)
        --sched->fuel;

    sched->running = to;
    the_thread = to;
    fiber_switch(thread_fiber(from), thread_fiber(to));
}